

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_hpf_uninit(ma_hpf *pHPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_hpf1 *in_RSI;
  long in_RDI;
  ma_uint32 ihpf2;
  ma_uint32 ihpf1;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  uint uVar2;
  
  if (in_RDI != 0) {
    for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 0xc); uVar2 = uVar2 + 1) {
      ma_hpf1_uninit(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    }
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 0x10); uVar1 = uVar1 + 1) {
      ma_hpf2_uninit((ma_hpf2 *)in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,uVar1));
    }
    if (*(int *)(in_RDI + 0x30) != 0) {
      ma_free(in_RSI,(ma_allocation_callbacks *)CONCAT44(uVar2,uVar1));
    }
  }
  return;
}

Assistant:

MA_API void ma_hpf_uninit(ma_hpf* pHPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ihpf1;
    ma_uint32 ihpf2;

    if (pHPF == NULL) {
        return;
    }

    for (ihpf1 = 0; ihpf1 < pHPF->hpf1Count; ihpf1 += 1) {
        ma_hpf1_uninit(&pHPF->pHPF1[ihpf1], pAllocationCallbacks);
    }

    for (ihpf2 = 0; ihpf2 < pHPF->hpf2Count; ihpf2 += 1) {
        ma_hpf2_uninit(&pHPF->pHPF2[ihpf2], pAllocationCallbacks);
    }

    if (pHPF->_ownsHeap) {
        ma_free(pHPF->_pHeap, pAllocationCallbacks);
    }
}